

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamFormatParser_p.cpp
# Opt level: O2

void __thiscall BamTools::Internal::SamFormatParser::Parse(SamFormatParser *this,string *headerText)

{
  istream *piVar1;
  string headerLine;
  istringstream headerStream;
  
  SamHeader::Clear(this->m_header);
  if (headerText->_M_string_length != 0) {
    std::__cxx11::istringstream::istringstream
              ((istringstream *)&headerStream,(string *)headerText,_S_in);
    headerLine._M_dataplus._M_p = (pointer)&headerLine.field_2;
    headerLine._M_string_length = 0;
    headerLine.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&headerStream,(string *)&headerLine);
      if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
      ParseSamLine(this,&headerLine);
    }
    std::__cxx11::string::~string((string *)&headerLine);
    std::__cxx11::istringstream::~istringstream((istringstream *)&headerStream);
  }
  return;
}

Assistant:

void SamFormatParser::Parse(const std::string& headerText)
{

    // clear header's prior contents
    m_header.Clear();

    // empty header is OK, but skip processing
    if (headerText.empty()) {
        return;
    }

    // other wise parse SAM lines
    std::istringstream headerStream(headerText);
    std::string headerLine;
    while (std::getline(headerStream, headerLine)) {
        ParseSamLine(headerLine);
    }
}